

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall
spdlog::details::async_msg::async_msg
          (async_msg *this,async_logger_ptr *worker,async_msg_type the_type,log_msg *m)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  log_msg_buffer::log_msg_buffer(&this->super_log_msg_buffer,m);
  this->msg_type = the_type;
  (this->worker_ptr).super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (worker->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (worker->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (worker->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->worker_ptr).super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->worker_ptr).super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (worker->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

async_msg(async_logger_ptr &&worker, async_msg_type the_type, const details::log_msg &m)
        : log_msg_buffer{m}
        , msg_type{the_type}
        , worker_ptr{std::move(worker)}
    {}